

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void checkFragmentCompat(Section *target,Section *other)

{
  uint16_t uVar1;
  uint local_20;
  int32_t ofs;
  uint16_t org;
  Section *other_local;
  Section *target_local;
  
  if ((other->isAddressFixed & 1U) == 0) {
    if ((other->isAlignFixed & 1U) != 0) {
      local_20 = (int)((uint)other->alignOfs - (uint)target->size) % (int)(other->alignMask + 1);
      if ((int)local_20 < 0) {
        local_20 = other->alignMask + 1 + local_20;
      }
      if ((target->isAddressFixed & 1U) == 0) {
        if (((target->isAlignFixed & 1U) != 0) &&
           ((uint)(other->alignMask & target->alignOfs) != (target->alignMask & local_20))) {
          errx("Section \"%s\" is defined with conflicting %d-byte alignment (offset %u) and %d-byte alignment (offset %u)"
               ,other->name,(ulong)(target->alignMask + 1),(ulong)target->alignOfs,
               (ulong)(other->alignMask + 1),(ulong)other->alignOfs);
        }
        if (((target->isAlignFixed & 1U) == 0) || (target->alignMask < other->alignMask)) {
          target->isAlignFixed = true;
          target->alignMask = other->alignMask;
          target->alignOfs = (uint16_t)local_20;
        }
      }
      else if ((target->org - local_20 & (uint)other->alignMask) != 0) {
        errx("Section \"%s\" is defined with conflicting address $%04x and %d-byte alignment (offset %u)"
             ,other->name,(ulong)target->org,(ulong)(other->alignMask + 1),(ulong)other->alignOfs);
      }
    }
  }
  else {
    uVar1 = other->org - target->size;
    if ((target->isAddressFixed & 1U) == 0) {
      if (((target->isAlignFixed & 1U) != 0) &&
         ((uVar1 - target->alignOfs & target->alignMask) != 0)) {
        errx("Section \"%s\" is defined with conflicting %d-byte alignment (offset %u) and address $%04x"
             ,other->name,(ulong)(target->alignMask + 1),(ulong)target->alignOfs,(ulong)other->org);
      }
    }
    else if (target->org != uVar1) {
      errx("Section \"%s\" is defined with conflicting addresses $%04x and $%04x",other->name,
           (ulong)target->org,(ulong)other->org);
    }
    target->isAddressFixed = true;
    target->org = uVar1;
  }
  return;
}

Assistant:

static void checkFragmentCompat(struct Section *target, struct Section *other)
{
	if (other->isAddressFixed) {
		uint16_t org = other->org - target->size;

		if (target->isAddressFixed) {
			if (target->org != org)
				errx("Section \"%s\" is defined with conflicting addresses $%04"
				     PRIx16 " and $%04" PRIx16,
				     other->name, target->org, other->org);

		} else if (target->isAlignFixed) {
			if ((org - target->alignOfs) & target->alignMask)
				errx("Section \"%s\" is defined with conflicting %d-byte alignment (offset %"
				     PRIu16 ") and address $%04" PRIx16,
				     other->name, target->alignMask + 1,
				     target->alignOfs, other->org);
		}
		target->isAddressFixed = true;
		target->org = org;

	} else if (other->isAlignFixed) {
		int32_t ofs = (other->alignOfs - target->size) % (other->alignMask + 1);

		if (ofs < 0)
			ofs += other->alignMask + 1;

		if (target->isAddressFixed) {
			if ((target->org - ofs) & other->alignMask)
				errx("Section \"%s\" is defined with conflicting address $%04"
				     PRIx16 " and %d-byte alignment (offset %" PRIu16 ")",
				     other->name, target->org,
				     other->alignMask + 1, other->alignOfs);

		} else if (target->isAlignFixed
			&& (other->alignMask & target->alignOfs) != (target->alignMask & ofs)) {
			errx("Section \"%s\" is defined with conflicting %d-byte alignment (offset %"
			     PRIu16 ") and %d-byte alignment (offset %" PRIu16 ")",
			     other->name, target->alignMask + 1, target->alignOfs,
			     other->alignMask + 1, other->alignOfs);

		} else if (!target->isAlignFixed || (other->alignMask > target->alignMask)) {
			target->isAlignFixed = true;
			target->alignMask = other->alignMask;
			target->alignOfs = ofs;
		}
	}
}